

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O0

int EVP_DecodeBase64(uint8_t *out,size_t *out_len,size_t max_out,uint8_t *in,size_t in_len)

{
  int iVar1;
  size_t local_58;
  size_t num_bytes_resulting;
  size_t bytes_out;
  size_t i;
  size_t max_len;
  size_t in_len_local;
  uint8_t *in_local;
  size_t max_out_local;
  size_t *out_len_local;
  uint8_t *out_local;
  
  *out_len = 0;
  if ((in_len & 3) == 0) {
    max_len = in_len;
    in_len_local = (size_t)in;
    in_local = (uint8_t *)max_out;
    max_out_local = (size_t)out_len;
    out_len_local = (size_t *)out;
    iVar1 = EVP_DecodedLength(&i,in_len);
    if ((iVar1 == 0) || (in_local < i)) {
      out_local._4_4_ = 0;
    }
    else {
      num_bytes_resulting = 0;
      for (bytes_out = 0; bytes_out < max_len; bytes_out = bytes_out + 4) {
        iVar1 = base64_decode_quad((uint8_t *)out_len_local,&local_58,
                                   (uint8_t *)(in_len_local + bytes_out));
        if (iVar1 == 0) {
          return 0;
        }
        num_bytes_resulting = local_58 + num_bytes_resulting;
        out_len_local = (size_t *)(local_58 + (long)out_len_local);
        if ((local_58 != 3) && (bytes_out != max_len - 4)) {
          return 0;
        }
      }
      *(size_t *)max_out_local = num_bytes_resulting;
      out_local._4_4_ = 1;
    }
  }
  else {
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

int EVP_DecodeBase64(uint8_t *out, size_t *out_len, size_t max_out,
                     const uint8_t *in, size_t in_len) {
  *out_len = 0;

  if (in_len % 4 != 0) {
    return 0;
  }

  size_t max_len;
  if (!EVP_DecodedLength(&max_len, in_len) || max_out < max_len) {
    return 0;
  }

  size_t i, bytes_out = 0;
  for (i = 0; i < in_len; i += 4) {
    size_t num_bytes_resulting;

    if (!base64_decode_quad(out, &num_bytes_resulting, &in[i])) {
      return 0;
    }

    bytes_out += num_bytes_resulting;
    out += num_bytes_resulting;
    if (num_bytes_resulting != 3 && i != in_len - 4) {
      return 0;
    }
  }

  *out_len = bytes_out;
  return 1;
}